

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O1

RTQuaternion * __thiscall RTQuaternion::operator=(RTQuaternion *this,RTQuaternion *quat)

{
  if (this != quat) {
    this->m_data[0] = quat->m_data[0];
    this->m_data[1] = quat->m_data[1];
    this->m_data[2] = quat->m_data[2];
    this->m_data[3] = quat->m_data[3];
  }
  return this;
}

Assistant:

RTQuaternion& RTQuaternion::operator =(const RTQuaternion& quat)
{
    if (this == &quat)
        return *this;

    m_data[0] = quat.m_data[0];
    m_data[1] = quat.m_data[1];
    m_data[2] = quat.m_data[2];
    m_data[3] = quat.m_data[3];

    return *this;
}